

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * __thiscall IR::Instr::Clone(Instr *this)

{
  Func *this_00;
  code *pcVar1;
  IRKind IVar2;
  bool bVar3;
  uint32 offset;
  Cloner *this_01;
  BranchInstr *this_02;
  ProfiledInstr *this_03;
  LabelInstr *this_04;
  PragmaInstr *this_05;
  JitProfilingInstr *this_06;
  undefined4 *puVar4;
  Opnd *pOVar5;
  Opnd *opnd;
  Instr *instrClone;
  Cloner *cloner;
  Func *func;
  Instr *this_local;
  
  this_00 = this->m_func;
  this_01 = Func::GetCloner(this_00);
  IVar2 = GetKind(this);
  switch(IVar2) {
  case InstrKindInstr:
    opnd = (Opnd *)CloneInstr(this);
    break;
  case InstrKindBranch:
    this_02 = AsBranchInstr(this);
    opnd = (Opnd *)BranchInstr::CloneBranchInstr(this_02);
    break;
  case InstrKindLabel:
  case InstrKindProfiledLabel:
    this_04 = AsLabelInstr(this);
    opnd = (Opnd *)LabelInstr::CloneLabel(this_04,1);
    break;
  case InstrKindProfiled:
    this_03 = AsProfiledInstr(this);
    opnd = (Opnd *)ProfiledInstr::CloneProfiledInstr(this_03);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x295,"(0)","Clone of this instr kind NYI");
    if (bVar3) {
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
      return (Instr *)0x0;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case InstrKindPragma:
    this_05 = AsPragmaInstr(this);
    opnd = (Opnd *)PragmaInstr::ClonePragma(this_05);
    break;
  case InstrKindJitProfiling:
    this_06 = AsJitProfilingInstr(this);
    opnd = (Opnd *)JitProfilingInstr::CloneJitProfiling(this_06);
  }
  pOVar5 = GetDst(this);
  if (pOVar5 != (Opnd *)0x0) {
    pOVar5 = Opnd::CloneDef(pOVar5,this_00);
    SetDst((Instr *)opnd,pOVar5);
  }
  pOVar5 = GetSrc1(this);
  if (pOVar5 != (Opnd *)0x0) {
    pOVar5 = Opnd::CloneUse(pOVar5,this_00);
    SetSrc1((Instr *)opnd,pOVar5);
    pOVar5 = GetSrc2(this);
    if (pOVar5 != (Opnd *)0x0) {
      pOVar5 = Opnd::CloneUse(pOVar5,this_00);
      SetSrc2((Instr *)opnd,pOVar5);
    }
  }
  bVar3 = Func::DoMaintainByteCodeOffset(this->m_func);
  if (bVar3) {
    offset = GetByteCodeOffset(this);
    SetByteCodeOffset((Instr *)opnd,offset);
  }
  *(ushort *)((long)&opnd[3]._vptr_Opnd + 6) =
       *(ushort *)((long)&opnd[3]._vptr_Opnd + 6) & 0xffef |
       (*(ushort *)&this->field_0x36 >> 4 & 1) << 4;
  Cloner::AddInstr(this_01,this,(Instr *)opnd);
  return (Instr *)opnd;
}

Assistant:

Instr *
Instr::Clone()
{
    Func * func = this->m_func;
    Cloner *cloner = func->GetCloner();
    IR::Instr * instrClone;
    IR::Opnd * opnd;

    switch (this->GetKind())
    {
    case InstrKindInstr:
        instrClone = this->CloneInstr();
        break;
    case InstrKindBranch:
        instrClone = this->AsBranchInstr()->CloneBranchInstr();
        break;
    case InstrKindProfiled:
        instrClone = this->AsProfiledInstr()->CloneProfiledInstr();
        break;
    case InstrKindLabel:
    case InstrKindProfiledLabel:
        instrClone = this->AsLabelInstr()->CloneLabel(true);
        break;
    case InstrKindPragma:
        instrClone = this->AsPragmaInstr()->ClonePragma();
        break;
    case InstrKindJitProfiling:
        instrClone = this->AsJitProfilingInstr()->CloneJitProfiling();
        break;
    default:
        AssertMsg(0, "Clone of this instr kind NYI");
        return nullptr;
    }

    opnd = this->GetDst();
    if (opnd)
    {
        instrClone->SetDst(opnd->CloneDef(func));
    }
    opnd = this->GetSrc1();
    if (opnd)
    {
        instrClone->SetSrc1(opnd->CloneUse(func));
        opnd = this->GetSrc2();
        if (opnd)
        {
            instrClone->SetSrc2(opnd->CloneUse(func));
        }
    }
    if (this->m_func->DoMaintainByteCodeOffset())
    {
        instrClone->SetByteCodeOffset(this->GetByteCodeOffset());
    }
    instrClone->usesStackArgumentsObject = this->usesStackArgumentsObject;
    cloner->AddInstr(this, instrClone);

    return instrClone;
}